

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Assign<int,duckdb::hugeint_t,duckdb::ArgMinMaxState<int,duckdb::hugeint_t>>
               (ArgMinMaxState<int,_duckdb::hugeint_t> *state,int *x,hugeint_t *y,bool x_null)

{
  byte in_CL;
  undefined8 *in_RDX;
  int *in_RSI;
  long in_RDI;
  hugeint_t new_value;
  
  *(byte *)(in_RDI + 1) = in_CL & 1;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    ArgMinMaxStateBase::AssignValue<int>((int *)(in_RDI + 4),*in_RSI);
  }
  new_value.upper = (int64_t)*in_RDX;
  new_value.lower = in_RDX[1];
  ArgMinMaxStateBase::AssignValue<duckdb::hugeint_t>
            ((ArgMinMaxStateBase *)(in_RDI + 8),(hugeint_t *)*in_RDX,new_value);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}